

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O0

int QMdi::MinOverlapPlacer::accumulatedOverlap(QRect *source,QList<QRect> *rects)

{
  bool bVar1;
  int iVar2;
  const_iterator o;
  long in_FS_OFFSET;
  QRect *rect;
  QList<QRect> *__range1;
  int accOverlap;
  QRect intersection;
  const_iterator __end1;
  const_iterator __begin1;
  QRect *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  int local_44;
  const_iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_44 = 0;
  local_10.i = (QRect *)&DAT_aaaaaaaaaaaaaaaa;
  local_10 = QList<QRect>::begin((QList<QRect> *)
                                 CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  o = QList<QRect>::end((QList<QRect> *)
                        CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  while( true ) {
    bVar1 = QList<QRect>::const_iterator::operator!=(&local_10,o);
    if (!bVar1) break;
    QList<QRect>::const_iterator::operator*(&local_10);
    QRect::intersected((QRect *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                       in_stack_ffffffffffffff98);
    in_stack_ffffffffffffffa4 = QRect::width(in_stack_ffffffffffffff98);
    iVar2 = QRect::height(in_stack_ffffffffffffff98);
    local_44 = in_stack_ffffffffffffffa4 * iVar2 + local_44;
    QList<QRect>::const_iterator::operator++(&local_10);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_44;
  }
  __stack_chk_fail();
}

Assistant:

int MinOverlapPlacer::accumulatedOverlap(const QRect &source, const QList<QRect> &rects)
{
    int accOverlap = 0;
    for (const QRect &rect : rects) {
        QRect intersection = source.intersected(rect);
        accOverlap += intersection.width() * intersection.height();
    }
    return accOverlap;
}